

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NtkPrintDistribInternal
               (FILE *pFile,Abc_Ntk_t *pNtk,char *pFanins,char *pFanouts,char *pNode,char *pFanin,
               char *pFanout,Vec_Int_t *vFan,Vec_Int_t *vFon,Vec_Int_t *vFanR,Vec_Int_t *vFonR)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  uint local_5c;
  uint local_54;
  int EntryFon;
  int EntryFan;
  int nSizeMax;
  int k;
  char *pFanin_local;
  char *pNode_local;
  char *pFanouts_local;
  char *pFanins_local;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  iVar1 = Vec_IntSize(vFan);
  iVar2 = Vec_IntSize(vFon);
  iVar1 = Abc_MaxInt(iVar1,iVar2);
  fprintf((FILE *)pFile,"The distribution of %s and %s in the network:\n",pFanins,pFanouts);
  fprintf((FILE *)pFile,"  Number   %s with %s  %s with %s          Repr1             Repr2\n",pNode
          ,pFanin,pNode,pFanout);
  for (EntryFan = 0; EntryFan < iVar1; EntryFan = EntryFan + 1) {
    iVar2 = Vec_IntSize(vFan);
    if (EntryFan < iVar2) {
      local_54 = Vec_IntEntry(vFan,EntryFan);
    }
    else {
      local_54 = 0;
    }
    iVar2 = Vec_IntSize(vFon);
    if (EntryFan < iVar2) {
      local_5c = Vec_IntEntry(vFon,EntryFan);
    }
    else {
      local_5c = 0;
    }
    if ((local_54 != 0) || (local_5c != 0)) {
      fprintf((FILE *)pFile,"%5d : ",(ulong)(uint)EntryFan);
      if (local_54 == 0) {
        fprintf((FILE *)pFile,"              ");
      }
      else {
        fprintf((FILE *)pFile,"%12d  ",(ulong)local_54);
      }
      fprintf((FILE *)pFile,"    ");
      if (local_5c == 0) {
        fprintf((FILE *)pFile,"              ");
      }
      else {
        fprintf((FILE *)pFile,"%12d  ",(ulong)local_5c);
      }
      fprintf((FILE *)pFile,"        ");
      if (local_54 == 0) {
        fprintf((FILE *)pFile,"              ");
      }
      else {
        iVar2 = Vec_IntEntry(vFanR,EntryFan);
        pAVar3 = Abc_NtkObj(pNtk,iVar2);
        pcVar4 = Abc_ObjName(pAVar3);
        fprintf((FILE *)pFile,"%12s  ",pcVar4);
      }
      fprintf((FILE *)pFile,"    ");
      if (local_5c == 0) {
        fprintf((FILE *)pFile,"              ");
      }
      else {
        iVar2 = Vec_IntEntry(vFonR,EntryFan);
        pAVar3 = Abc_NtkObj(pNtk,iVar2);
        pcVar4 = Abc_ObjName(pAVar3);
        fprintf((FILE *)pFile,"%12s  ",pcVar4);
      }
      fprintf((FILE *)pFile,"\n");
    }
  }
  return;
}

Assistant:

void Abc_NtkPrintDistribInternal( FILE * pFile, Abc_Ntk_t * pNtk, char * pFanins, char * pFanouts, char * pNode, char * pFanin, char * pFanout, 
                                 Vec_Int_t * vFan, Vec_Int_t * vFon, Vec_Int_t * vFanR, Vec_Int_t * vFonR )
{
    int k, nSizeMax = Abc_MaxInt( Vec_IntSize(vFan), Vec_IntSize(vFon) );
    fprintf( pFile, "The distribution of %s and %s in the network:\n", pFanins, pFanouts );
    fprintf( pFile, "  Number   %s with %s  %s with %s          Repr1             Repr2\n", pNode, pFanin, pNode, pFanout );
    for ( k = 0; k < nSizeMax; k++ )
    {
        int EntryFan = k < Vec_IntSize(vFan) ? Vec_IntEntry(vFan, k) : 0;
        int EntryFon = k < Vec_IntSize(vFon) ? Vec_IntEntry(vFon, k) : 0;
        if ( EntryFan == 0 && EntryFon == 0 )
            continue;

        fprintf( pFile, "%5d : ", k );
        if ( EntryFan == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12d  ", EntryFan );
        fprintf( pFile, "    " );
        if ( EntryFon == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12d  ", EntryFon );

        fprintf( pFile, "        " );
        if ( EntryFan == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12s  ", Abc_ObjName(Abc_NtkObj(pNtk, Vec_IntEntry(vFanR, k))) );
        fprintf( pFile, "    " );
        if ( EntryFon == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12s  ", Abc_ObjName(Abc_NtkObj(pNtk, Vec_IntEntry(vFonR, k))) );
        fprintf( pFile, "\n" );
    }
}